

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

CompilationUnitSymbol * __thiscall slang::ast::Compilation::createScriptScope(Compilation *this)

{
  RootSymbol *pRVar1;
  CompilationUnitSymbol *member;
  
  member = BumpAllocator::
           emplace<slang::ast::CompilationUnitSymbol,slang::ast::Compilation&,slang::SourceLibrary_const&>
                     (&this->super_BumpAllocator,this,this->defaultLibPtr);
  pRVar1 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  Scope::insertMember(&pRVar1->super_Scope,&member->super_Symbol,(pRVar1->super_Scope).lastMember,
                      false,true);
  return member;
}

Assistant:

CompilationUnitSymbol& Compilation::createScriptScope() {
    SLANG_ASSERT(!isFrozen());

    auto unit = emplace<CompilationUnitSymbol>(*this, getDefaultLibrary());
    root->addMember(*unit);
    return *unit;
}